

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecSt.c
# Opt level: O3

void Acec_StatsCollect(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  char **ppcVar6;
  void *__s;
  Vec_Wrd_t *vTemp;
  word *__s_00;
  word wVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int *__s_01;
  int Map [256];
  int local_438 [258];
  
  __s = (void *)0x0;
  ppcVar6 = Kit_DsdNpn4ClassNames();
  __s_01 = local_438;
  memset(__s_01,0,0x400);
  uVar10 = p->nObjs;
  lVar8 = (long)(int)uVar10;
  uVar16 = 0x10;
  if (0xe < uVar10 - 1) {
    uVar16 = uVar10;
  }
  if (uVar16 != 0) {
    __s = malloc((long)(int)uVar16 * 8);
  }
  __s_00 = (word *)0x0;
  memset(__s,0,lVar8 * 8);
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  vTemp->nCap = uVar16;
  if (uVar16 != 0) {
    __s_00 = (word *)malloc((long)(int)uVar16 << 3);
  }
  vTemp->pArray = __s_00;
  vTemp->nSize = uVar10;
  memset(__s_00,0,lVar8 * 8);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                  ,0x165,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  iVar5 = Gia_ManLutSizeMax(p);
  if (3 < iVar5) {
    __assert_fail("Gia_ManLutSizeMax(p) < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                  ,0x166,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  uVar16 = p->nObjs;
  if (1 < (int)uVar16) {
    lVar11 = 1;
    do {
      if (p->vMapping->nSize <= lVar11) goto LAB_0067f091;
      if (p->vMapping->pArray[lVar11] != 0) {
        wVar7 = Gia_ObjComputeTruthTable6Lut(p,(int)lVar11,vTemp);
        if (lVar8 <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        *(word *)((long)__s + lVar11 * 8) = wVar7;
        uVar16 = p->nObjs;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)uVar16);
  }
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
    uVar16 = p->nObjs;
  }
  free(vTemp);
  if (1 < (int)uVar16) {
    pVVar2 = p->vMapping;
    uVar13 = pVVar2->nSize;
    uVar9 = 1;
    if (1 < (int)uVar13) {
      uVar9 = (ulong)uVar13;
    }
    uVar12 = 1;
    do {
      if (uVar12 == uVar9) {
LAB_0067f091:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = pVVar2->pArray;
      uVar1 = piVar3[uVar12];
      uVar14 = (ulong)uVar1;
      if (uVar14 != 0) {
        if (lVar8 <= (long)uVar12) goto LAB_0067f053;
        iVar5 = Npn3Table[*(byte *)((long)__s + uVar12 * 8)][1];
        if (0xe < iVar5) {
          __assert_fail("iTruth < 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                        ,0x173,"void Acec_StatsCollect(Gia_Man_t *, int)");
        }
        if (((int)uVar1 < 0) || (uVar13 <= uVar1)) goto LAB_0067f091;
        uVar1 = piVar3[uVar14];
        uVar4 = uVar1;
        if ((int)uVar1 < 1) {
          uVar4 = 0;
        }
        if (0 < (int)uVar1) {
          uVar15 = 0;
          do {
            uVar1 = piVar3[uVar14 + uVar15 + 1];
            if (((long)(int)uVar1 < 0) || (uVar10 <= uVar1)) goto LAB_0067f053;
            if (0xe < Npn3Table[*(byte *)((long)__s + (long)(int)uVar1 * 8)][1]) {
              __assert_fail("iTruthF < 15",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                            ,0x178,"void Acec_StatsCollect(Gia_Man_t *, int)");
            }
            local_438[Npn3Table[*(byte *)((long)__s + (long)(int)uVar1 * 8)][1] * 0x10 + iVar5] =
                 local_438[Npn3Table[*(byte *)((long)__s + (long)(int)uVar1 * 8)][1] * 0x10 + iVar5]
                 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar4 != uVar15);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar16);
  }
  lVar8 = (long)p->vCos->nSize;
  if (lVar8 < 1) {
    if (__s == (void *)0x0) goto LAB_0067ef2a;
  }
  else {
    piVar3 = p->vCos->pArray;
    lVar11 = 0;
    do {
      iVar5 = piVar3[lVar11];
      if (((long)iVar5 < 0) || ((int)uVar16 <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar13 = iVar5 - (*(uint *)(p->pObjs + iVar5) & 0x1fffffff);
      if (((int)uVar13 < 0) || ((int)uVar10 <= (int)uVar13)) {
LAB_0067f053:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (0xe < Npn3Table[*(byte *)((long)__s + (ulong)uVar13 * 8)][1]) {
        __assert_fail("iTruthF < 15",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                      ,0x180,"void Acec_StatsCollect(Gia_Man_t *, int)");
      }
      local_438[Npn3Table[*(byte *)((long)__s + (ulong)uVar13 * 8)][1] << 4] =
           local_438[Npn3Table[*(byte *)((long)__s + (ulong)uVar13 * 8)][1] << 4] + 1;
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
  }
  free(__s);
LAB_0067ef2a:
  printf("fi / fo");
  uVar10 = 0;
  do {
    printf("%6d ",(ulong)uVar10);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0xe);
  putchar(10);
  uVar9 = 0;
  do {
    printf("%6d ",uVar9 & 0xffffffff);
    lVar8 = 0;
    do {
      if (__s_01[lVar8] == 0) {
        printf("%6s ",".");
      }
      else {
        printf("%6d ");
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xe);
    putchar(10);
    uVar9 = uVar9 + 1;
    __s_01 = __s_01 + 0x10;
  } while (uVar9 != 0xe);
  puts("\nClasses:");
  uVar10 = 0;
  do {
    lVar8 = 0;
    while (Npn3Table[lVar8][1] != uVar10) {
      lVar8 = lVar8 + 1;
      if (lVar8 == 0x100) {
        __assert_fail("k < 256",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                      ,0x19a,"void Acec_StatsCollect(Gia_Man_t *, int)");
      }
    }
    iVar5 = Dar_LibReturnClass(Npn3Table[lVar8][0] << 8 | Npn3Table[lVar8][0]);
    printf("%2d : %s\n",(ulong)uVar10,ppcVar6[iVar5]);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0xe);
  return;
}

Assistant:

void Acec_StatsCollect( Gia_Man_t * p, int fVerbose )
{
    extern int Dar_LibReturnClass( unsigned uTruth );
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();

    int Map[256] = {0};
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    word Truth, TruthF;
    int iTruth, iTruthF;
    int iFan, iLut, i, k, Class;
    assert( Gia_ManHasMapping(p) );
    assert( Gia_ManLutSizeMax(p) < 4 );
    // collect truth tables
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Gia_ObjComputeTruthTable6Lut( p, iLut, vTemp );
        Vec_WrdWriteEntry( vTruths, iLut, Truth );
    }
    Vec_WrdFree( vTemp );
    // collect pairs
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Vec_WrdEntry( vTruths, iLut ) & 0xFF;
        iTruth = Npn3Table[Truth][1];
        assert( iTruth < 15 );
        Gia_LutForEachFanin( p, iLut, iFan, k )
        {
            TruthF = Vec_WrdEntry( vTruths, iFan ) & 0xFF;
            iTruthF = Npn3Table[TruthF][1];
            assert( iTruthF < 15 );
            Map[(iTruthF << 4) + iTruth]++;
        }
    }
    Gia_ManForEachCoDriverId( p, iFan, k )
    {
        TruthF = Vec_WrdEntry( vTruths, iFan );
        iTruthF = Npn3Table[TruthF & 0xFF][1];
        assert( iTruthF < 15 );
        Map[(iTruthF << 4)]++;
    }
    Vec_WrdFree( vTruths );
    // print statistics
    printf( "fi / fo" );
    for ( i = 0; i < 14; i++ )
        printf( "%6d ", i );
    printf( "\n" );
    for ( i = 0; i < 14; i++ )
    {
        printf( "%6d ", i );
        for ( k = 0; k < 14; k++ )
            if ( Map[(i << 4) | k] )
                printf( "%6d ", Map[(i << 4) | k] );
            else
                printf( "%6s ", "." );
        printf( "\n" );
    }
    // print class formulas
    printf( "\nClasses:\n" );
    for ( i = 0; i < 14; i++ )
    {
        for ( k = 0; k < 256; k++ )
            if ( Npn3Table[k][1] == i )
                break;
        assert( k < 256 );
        Class = Dar_LibReturnClass( (Npn3Table[k][0] << 8) | Npn3Table[k][0] );
        printf( "%2d : %s\n", i, pNames[Class] );
    }
}